

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O2

void P2Pt::multm3x3<double>(double (*m1) [3] [3],double (*m2) [3] [3],double (*output_m) [3])

{
  undefined1 auVar1 [16];
  uint i;
  long lVar2;
  uint k;
  long lVar3;
  double (*padVar4) [3];
  uint j;
  long lVar5;
  double (*padVar6) [3];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    lVar5 = 0;
    padVar4 = *m2;
    for (; lVar5 != 3; lVar5 = lVar5 + 1) {
      output_m[lVar2][lVar5] = 0.0;
      auVar7 = ZEXT816(0) << 0x40;
      padVar6 = padVar4;
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (*(double (*) [3])*padVar6)[0];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (*(double (*) [3])(*m1)[0])[lVar3];
        auVar7 = vfmadd231sd_fma(auVar7,auVar8,auVar1);
        output_m[lVar2][lVar5] = auVar7._0_8_;
        padVar6 = padVar6 + 1;
      }
      padVar4 = (double (*) [3])(*padVar4 + 1);
    }
    m1 = (double (*) [3] [3])((long)m1 + 0x18);
  }
  return;
}

Assistant:

inline void
multm3x3(const T (&m1)[3][3], const T (&m2)[3][3], T output_m[][3])
{
	for (unsigned i = 0; i < 3; i++)
		for (unsigned j = 0; j < 3; j++) {
			output_m[i][j] = 0;
			for (unsigned k = 0; k < 3; k++)
				output_m[i][j] += m1[i][k] * m2[k][j];
		}
}